

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_invsqrtf.h
# Opt level: O1

void __thiscall
InvSqrtfTest::InvSqrtfTest
          (InvSqrtfTest *this,input_generator_t *inputGenerator,input_range_t *inputRange,
          uint64_t samplesInRange)

{
  input_range_t inputRange_00;
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  string local_68;
  _Any_data local_48;
  code *local_38;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"1 / sqrtf","");
  std::
  function<std::vector<float,_std::allocator<float>_>_(const_std::pair<float,_float>_&,_unsigned_long)>
  ::function((function<std::vector<float,_std::allocator<float>_>_(const_std::pair<float,_float>_&,_unsigned_long)>
              *)&local_48,inputGenerator);
  uVar1 = -(uint)(0.0 < inputRange->first);
  fVar3 = (float)(~uVar1 & 0x800000 | (uint)inputRange->first & uVar1);
  uVar1 = -(uint)(0.0 < inputRange->second);
  fVar4 = (float)(~uVar1 & 0x800000 | (uint)inputRange->second & uVar1);
  fVar2 = 3.4028235e+38;
  if (fVar3 <= 3.4028235e+38) {
    fVar2 = fVar3;
  }
  fVar3 = 3.4028235e+38;
  if (fVar4 <= 3.4028235e+38) {
    fVar3 = fVar4;
  }
  inputRange_00.second = fVar3;
  inputRange_00.first = fVar2;
  Test<float,float,double>::Test<long_double(*)(long_double),float(*)(float)>
            ((Test<float,float,double> *)this,&local_68,(input_generator_t *)&local_48,inputRange_00
             ,samplesInRange,invsqrtf_reference,dummyFunc);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

InvSqrtfTest(input_generator_t inputGenerator, const input_range_t& inputRange, uint64_t samplesInRange)
        : Test(
            "1 / sqrtf", inputGenerator,
            fixupInputRange(inputRange), samplesInRange, &invsqrtf_reference, &dummyFunc)
    {
    }